

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O1

void __thiscall TCPConnection::Allocate(TCPConnection *this,InterfaceMAC *mac)

{
  this->RxInOffset = 0;
  this->RxOutOffset = 0;
  this->TxOffset = 0;
  this->CurrentWindow = 0x100;
  this->TxBuffer = (DataBuffer *)0x0;
  this->RxBufferEmpty = true;
  this->NewConnection = (TCPConnection *)0x0;
  this->Parent = (TCPConnection *)0x0;
  this->MAC = mac;
  return;
}

Assistant:

void TCPConnection::Allocate(InterfaceMAC* mac)
{
    RxInOffset = 0;
    RxOutOffset = 0;
    TxOffset = 0;
    CurrentWindow = TCP_RX_WINDOW_SIZE;
    TxBuffer = nullptr;
    RxBufferEmpty = true;
    NewConnection = nullptr;
    Parent = nullptr;

    MAC = mac;
}